

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O3

void __thiscall
duckdb::MergeSorter::MergeRows
          (MergeSorter *this,data_ptr_t *l_ptr,idx_t *l_entry_idx,idx_t *l_count,data_ptr_t *r_ptr,
          idx_t *r_entry_idx,idx_t *r_count,RowDataBlock *target_block,data_ptr_t *target_ptr,
          idx_t *entry_size,bool *left_smaller,idx_t *copied,idx_t *count)

{
  bool bVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = target_block->count;
  uVar5 = target_block->capacity - iVar2;
  if (*count - *copied < uVar5) {
    uVar5 = *count - *copied;
  }
  if (uVar5 == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar3 = uVar4;
      if ((*l_count <= *l_entry_idx) || (*r_count <= *r_entry_idx)) break;
      iVar2 = *copied;
      uVar3 = (ulong)left_smaller[uVar4 + iVar2] ^ 1;
      FastMemcpy(*target_ptr,
                 (void *)((long)*r_ptr * uVar3 + (ulong)left_smaller[uVar4 + iVar2] * (long)*l_ptr),
                 *entry_size);
      *target_ptr = *target_ptr + *entry_size;
      bVar1 = left_smaller[uVar4 + iVar2];
      *l_entry_idx = *l_entry_idx + (ulong)bVar1;
      *r_entry_idx = *r_entry_idx + uVar3;
      iVar2 = *entry_size;
      *l_ptr = *l_ptr + bVar1 * iVar2;
      *r_ptr = *r_ptr + uVar3 * iVar2;
      uVar4 = uVar4 + 1;
      uVar3 = uVar5;
    } while (uVar5 != uVar4);
    iVar2 = target_block->count;
  }
  target_block->count = iVar2 + uVar3;
  *copied = *copied + uVar3;
  return;
}

Assistant:

void MergeSorter::MergeRows(data_ptr_t &l_ptr, idx_t &l_entry_idx, const idx_t &l_count, data_ptr_t &r_ptr,
                            idx_t &r_entry_idx, const idx_t &r_count, RowDataBlock &target_block,
                            data_ptr_t &target_ptr, const idx_t &entry_size, const bool left_smaller[], idx_t &copied,
                            const idx_t &count) {
	const idx_t next = MinValue(count - copied, target_block.capacity - target_block.count);
	idx_t i;
	for (i = 0; i < next && l_entry_idx < l_count && r_entry_idx < r_count; i++) {
		const bool &l_smaller = left_smaller[copied + i];
		const bool r_smaller = !l_smaller;
		// Use comparison bool (0 or 1) to copy an entry from either side
		FastMemcpy(
		    target_ptr,
		    reinterpret_cast<data_ptr_t>(l_smaller * CastPointerToValue(l_ptr) + r_smaller * CastPointerToValue(r_ptr)),
		    entry_size);
		target_ptr += entry_size;
		// Use the comparison bool to increment entries and pointers
		l_entry_idx += l_smaller;
		r_entry_idx += r_smaller;
		l_ptr += l_smaller * entry_size;
		r_ptr += r_smaller * entry_size;
	}
	// Update counts
	target_block.count += i;
	copied += i;
}